

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

Status * __thiscall
draco::Encoder::EncodePointCloudToBuffer(Encoder *this,PointCloud *pc,EncoderBuffer *out_buffer)

{
  ExpertEncoder *in_RDI;
  ExpertEncoder encoder;
  PointCloud *in_stack_fffffffffffffe68;
  ExpertEncoder *this_00;
  EncoderBuffer *in_stack_fffffffffffffec0;
  ExpertEncoder *in_stack_fffffffffffffec8;
  PointCloud *in_stack_fffffffffffffef0;
  Encoder *in_stack_fffffffffffffef8;
  
  this_00 = in_RDI;
  ExpertEncoder::ExpertEncoder(in_RDI,in_stack_fffffffffffffe68);
  CreateExpertEncoderOptions(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  ExpertEncoder::Reset(this_00,(EncoderOptions *)in_stack_fffffffffffffe68);
  EncoderOptionsBase<int>::~EncoderOptionsBase((EncoderOptionsBase<int> *)this_00);
  ExpertEncoder::EncodeToBuffer(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  ExpertEncoder::~ExpertEncoder((ExpertEncoder *)0x156226);
  return (Status *)in_RDI;
}

Assistant:

Status Encoder::EncodePointCloudToBuffer(const PointCloud &pc,
                                         EncoderBuffer *out_buffer) {
  ExpertEncoder encoder(pc);
  encoder.Reset(CreateExpertEncoderOptions(pc));
  return encoder.EncodeToBuffer(out_buffer);
}